

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O0

int run_test_socket_buffer_size(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_18 [8];
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x3b,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&tcp);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x3d,"0 == uv_tcp_init(uv_default_loop(), &tcp)");
    abort();
  }
  iVar1 = uv_tcp_bind(&tcp,(sockaddr *)local_18,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x3e,"0 == uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0)");
    abort();
  }
  check_buffer_size((uv_handle_t *)&tcp);
  uv_close((uv_handle_t *)&tcp,close_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&udp);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x42,"0 == uv_udp_init(uv_default_loop(), &udp)");
    abort();
  }
  iVar1 = uv_udp_bind(&udp,(sockaddr *)local_18,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x43,"0 == uv_udp_bind(&udp, (struct sockaddr*) &addr, 0)");
    abort();
  }
  check_buffer_size((uv_handle_t *)&udp);
  uv_close((uv_handle_t *)&udp,close_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x47,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x49,"close_cb_called == 2");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-socket-buffer-size.c"
            ,0x4b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT(0 == uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT(0 == uv_udp_init(uv_default_loop(), &udp));
  ASSERT(0 == uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}